

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O0

void blake2b_transform(BLAKE2B_CTX *b2b,uint8_t *block,size_t num_bytes,int is_final_block)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  ulong local_c0;
  size_t i;
  uint8_t *s;
  int round;
  uint64_t v [16];
  int is_final_block_local;
  size_t num_bytes_local;
  uint8_t *block_local;
  BLAKE2B_CTX *b2b_local;
  
  v[0xf]._4_4_ = is_final_block;
  OPENSSL_memcpy(&stack0xffffffffffffff58,b2b,0x40);
  OPENSSL_memcpy(v + 7,kIV,0x40);
  b2b->t_low = num_bytes + b2b->t_low;
  if (b2b->t_low < num_bytes) {
    b2b->t_high = b2b->t_high + 1;
  }
  v[0xb] = b2b->t_low ^ v[0xb];
  v[0xc] = b2b->t_high ^ v[0xc];
  if (v[0xf]._4_4_ != 0) {
    v[0xd] = v[0xd] ^ 0xffffffffffffffff;
  }
  for (s._4_4_ = 0; s._4_4_ < 0xc; s._4_4_ = s._4_4_ + 1) {
    lVar3 = (long)(s._4_4_ % 10 << 4);
    uVar1 = blake2b_load(block,(ulong)""[lVar3]);
    uVar2 = blake2b_load(block,(ulong)""[lVar3 + 1]);
    blake2b_mix((uint64_t *)&stack0xffffffffffffff58,0,4,8,0xc,uVar1,uVar2);
    uVar1 = blake2b_load(block,(ulong)""[lVar3 + 2]);
    uVar2 = blake2b_load(block,(ulong)""[lVar3 + 3]);
    blake2b_mix((uint64_t *)&stack0xffffffffffffff58,1,5,9,0xd,uVar1,uVar2);
    uVar1 = blake2b_load(block,(ulong)""[lVar3 + 4]);
    uVar2 = blake2b_load(block,(ulong)""[lVar3 + 5]);
    blake2b_mix((uint64_t *)&stack0xffffffffffffff58,2,6,10,0xe,uVar1,uVar2);
    uVar1 = blake2b_load(block,(ulong)""[lVar3 + 6]);
    uVar2 = blake2b_load(block,(ulong)""[lVar3 + 7]);
    blake2b_mix((uint64_t *)&stack0xffffffffffffff58,3,7,0xb,0xf,uVar1,uVar2);
    uVar1 = blake2b_load(block,(ulong)""[lVar3 + 8]);
    uVar2 = blake2b_load(block,(ulong)""[lVar3 + 9]);
    blake2b_mix((uint64_t *)&stack0xffffffffffffff58,0,5,10,0xf,uVar1,uVar2);
    uVar1 = blake2b_load(block,(ulong)""[lVar3 + 10]);
    uVar2 = blake2b_load(block,(ulong)""[lVar3 + 0xb]);
    blake2b_mix((uint64_t *)&stack0xffffffffffffff58,1,6,0xb,0xc,uVar1,uVar2);
    uVar1 = blake2b_load(block,(ulong)""[lVar3 + 0xc]);
    uVar2 = blake2b_load(block,(ulong)""[lVar3 + 0xd]);
    blake2b_mix((uint64_t *)&stack0xffffffffffffff58,2,7,8,0xd,uVar1,uVar2);
    uVar1 = blake2b_load(block,(ulong)""[lVar3 + 0xe]);
    uVar2 = blake2b_load(block,(ulong)""[lVar3 + 0xf]);
    blake2b_mix((uint64_t *)&stack0xffffffffffffff58,3,4,9,0xe,uVar1,uVar2);
  }
  for (local_c0 = 0; local_c0 < 8; local_c0 = local_c0 + 1) {
    b2b->h[local_c0] = v[local_c0 - 1] ^ b2b->h[local_c0];
    b2b->h[local_c0] = v[local_c0 + 7] ^ b2b->h[local_c0];
  }
  return;
}

Assistant:

static void blake2b_transform(BLAKE2B_CTX *b2b,
                              const uint8_t block[BLAKE2B_CBLOCK],
                              size_t num_bytes, int is_final_block) {
  // https://tools.ietf.org/html/rfc7693#section-3.2
  uint64_t v[16];
  static_assert(sizeof(v) == sizeof(b2b->h) + sizeof(kIV), "");
  OPENSSL_memcpy(v, b2b->h, sizeof(b2b->h));
  OPENSSL_memcpy(&v[8], kIV, sizeof(kIV));

  b2b->t_low += num_bytes;
  if (b2b->t_low < num_bytes) {
    b2b->t_high++;
  }
  v[12] ^= b2b->t_low;
  v[13] ^= b2b->t_high;

  if (is_final_block) {
    v[14] = ~v[14];
  }

  for (int round = 0; round < 12; round++) {
    const uint8_t *const s = &kSigma[16 * (round % 10)];
    blake2b_mix(v, 0, 4, 8, 12, blake2b_load(block, s[0]),
                blake2b_load(block, s[1]));
    blake2b_mix(v, 1, 5, 9, 13, blake2b_load(block, s[2]),
                blake2b_load(block, s[3]));
    blake2b_mix(v, 2, 6, 10, 14, blake2b_load(block, s[4]),
                blake2b_load(block, s[5]));
    blake2b_mix(v, 3, 7, 11, 15, blake2b_load(block, s[6]),
                blake2b_load(block, s[7]));
    blake2b_mix(v, 0, 5, 10, 15, blake2b_load(block, s[8]),
                blake2b_load(block, s[9]));
    blake2b_mix(v, 1, 6, 11, 12, blake2b_load(block, s[10]),
                blake2b_load(block, s[11]));
    blake2b_mix(v, 2, 7, 8, 13, blake2b_load(block, s[12]),
                blake2b_load(block, s[13]));
    blake2b_mix(v, 3, 4, 9, 14, blake2b_load(block, s[14]),
                blake2b_load(block, s[15]));
  }

  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(b2b->h); i++) {
    b2b->h[i] ^= v[i];
    b2b->h[i] ^= v[i + 8];
  }
}